

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O0

stringpiece_ssize_type __thiscall
google::protobuf::StringPiece::rfind(StringPiece *this,char c,size_type pos)

{
  unsigned_long *puVar1;
  char in_SIL;
  long *in_RDI;
  stringpiece_ssize_type i;
  unsigned_long local_30;
  unsigned_long local_28;
  unsigned_long local_20;
  char local_11;
  
  if (0 < in_RDI[1]) {
    local_30 = in_RDI[1] - 1;
    local_11 = in_SIL;
    puVar1 = std::min<unsigned_long>(&local_20,&local_30);
    for (local_28 = *puVar1; -1 < (long)local_28; local_28 = local_28 - 1) {
      if (*(char *)(*in_RDI + local_28) == local_11) {
        return local_28;
      }
    }
  }
  return -1;
}

Assistant:

stringpiece_ssize_type StringPiece::rfind(char c, size_type pos) const {
  // Note: memrchr() is not available on Windows.
  if (length_ <= 0) return npos;
  for (stringpiece_ssize_type i =
      std::min(pos, static_cast<size_type>(length_ - 1));
       i >= 0; --i) {
    if (ptr_[i] == c) {
      return i;
    }
  }
  return npos;
}